

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void QWhatsThisPrivate::notifyToplevels(QEvent *e)

{
  QWidget **ppQVar1;
  QWidgetList *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  ppQVar1 = local_48.ptr;
  lVar3 = local_48.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    QCoreApplication::sendEvent(*(QObject **)((long)ppQVar1 + lVar2),e);
  }
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThisPrivate::notifyToplevels(QEvent *e)
{
    const QWidgetList toplevels = QApplication::topLevelWidgets();
    for (auto *w : toplevels)
        QCoreApplication::sendEvent(w, e);
}